

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_cast(lua_State *L)

{
  CTypeID CVar1;
  long *plVar2;
  lua_State *L_00;
  TValue *L_01;
  void *pvVar3;
  long in_RDI;
  GCcdata *cd;
  TValue *o;
  CType *d;
  CTypeID id;
  CTState *cts;
  CType *ct;
  GCcdata *cd_1;
  CTState *cts_1;
  undefined8 in_stack_fffffffffffffef8;
  lua_State *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff48;
  CTInfo flags;
  TValue *in_stack_ffffffffffffff50;
  uint8_t *in_stack_ffffffffffffff58;
  lua_State *d_00;
  undefined4 in_stack_ffffffffffffff68;
  CTypeID CVar4;
  TValue *in_stack_ffffffffffffff88;
  CTState *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  flags = (CTInfo)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  plVar2 = (long *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0xfc);
  plVar2[2] = in_RDI;
  CVar1 = ffi_checkctype((lua_State *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  L_00 = (lua_State *)(*plVar2 + (ulong)CVar1 * 0x10);
  while ((L_00->nextgc).gcptr32 >> 0x1c == 8) {
    L_00 = (lua_State *)(*plVar2 + (ulong)((L_00->nextgc).gcptr32 & 0xffff) * 0x10);
  }
  d_00 = L_00;
  CVar4 = CVar1;
  L_01 = lj_lib_checkany(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  *(TValue **)(in_RDI + 0x18) = L_01 + 1;
  if ((((L_00->nextgc).gcptr32 >> 0x1c != 0) && ((L_00->nextgc).gcptr32 >> 0x1c != 2)) &&
     ((L_00->nextgc).gcptr32 >> 0x1c != 5)) {
    lj_err_arg((lua_State *)&L_01->field_2,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (ErrMsg)in_stack_fffffffffffffef8);
  }
  if (((L_01->field_2).it != 0xfffffff5) || (*(ushort *)((ulong)(L_01->u32).lo + 6) != CVar1)) {
    pvVar3 = lj_mem_newgco((lua_State *)CONCAT44(CVar1,in_stack_ffffffffffffff10),
                           (MSize)((ulong)L_00 >> 0x20));
    *(undefined1 *)((long)pvVar3 + 5) = 10;
    *(short *)((long)pvVar3 + 6) = (short)CVar1;
    lj_cconv_ct_tv((CTState *)CONCAT44(CVar4,in_stack_ffffffffffffff68),(CType *)d_00,
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,flags);
    (L_01->u32).lo = (uint32_t)pvVar3;
    (L_01->field_2).it = 0xfffffff5;
    if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24) <=
        *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20)) {
      lj_gc_step(L_00);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}